

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::to_stream(Tree *this,size_t node,type_bits more_flags)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  NodeData *pNVar5;
  csubstr cVar6;
  char *pcStack_58;
  size_t local_50;
  char msg [37];
  
  bVar4 = has_children(this,node);
  if (bVar4) {
    builtin_strncpy(msg,"check failed: (! has_children(node))",0x25);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar6.len;
    pcStack_58 = cVar6.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x67fb) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x67fb) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x25,LVar3,(this->m_callbacks).m_user_data);
  }
  _set_flags(this,node,more_flags | 0x28);
  pNVar5 = _p(this,node);
  (pNVar5->m_key).tag.str = (char *)0x0;
  (pNVar5->m_key).tag.len = 0;
  (pNVar5->m_key).scalar.str = (char *)0x0;
  (pNVar5->m_key).scalar.len = 0;
  (pNVar5->m_key).anchor.str = (char *)0x0;
  (pNVar5->m_key).anchor.len = 0;
  pNVar5 = _p(this,node);
  (pNVar5->m_val).tag.str = (char *)0x0;
  (pNVar5->m_val).tag.len = 0;
  (pNVar5->m_val).scalar.str = (char *)0x0;
  (pNVar5->m_val).scalar.len = 0;
  (pNVar5->m_val).anchor.str = (char *)0x0;
  (pNVar5->m_val).anchor.len = 0;
  return;
}

Assistant:

void Tree::to_stream(size_t node, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _set_flags(node, STREAM|more_flags);
    _p(node)->m_key.clear();
    _p(node)->m_val.clear();
}